

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp,stbi__result_info *ri)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  stbi_uc sVar4;
  stbi_uc sVar5;
  byte bVar6;
  int iVar7;
  uchar *puVar8;
  char *pcVar9;
  long lVar10;
  stbi_uc *psVar11;
  ulong uVar12;
  uchar *puVar13;
  uint uVar14;
  int iVar15;
  uint y;
  uint uVar16;
  stbi_uc *psVar17;
  uint uVar18;
  long lVar19;
  int *piVar20;
  int left;
  int iVar21;
  uint uVar22;
  long in_FS_OFFSET;
  stbi_uc value [4];
  stbi__pic_packet packets [10];
  stbi_uc local_ac [4];
  ulong local_a8;
  ulong local_a0;
  stbi_uc *local_98;
  ulong local_90;
  int local_88;
  int local_84;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  uint *local_68;
  uint *local_60;
  stbi_uc asStack_58 [2];
  byte local_56 [38];
  
  iVar15 = 0x5c;
  local_84 = req_comp;
  local_68 = (uint *)px;
  local_60 = (uint *)py;
  do {
    stbi__get8(s);
    iVar15 = iVar15 + -1;
  } while (iVar15 != 0);
  bVar2 = stbi__get8(s);
  bVar3 = stbi__get8(s);
  sVar4 = stbi__get8(s);
  sVar5 = stbi__get8(s);
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00137695:
    if (s->img_buffer_end <= s->img_buffer) {
LAB_00137b99:
      pcVar9 = "bad file";
      goto LAB_00137bba;
    }
  }
  else {
    iVar15 = (*(s->io).eof)(s->io_user_data);
    if (iVar15 != 0) {
      if (s->read_from_callbacks != 0) goto LAB_00137695;
      goto LAB_00137b99;
    }
  }
  local_90 = (ulong)bVar2 << 8;
  uVar22 = (int)local_90 + (uint)bVar3;
  y = (uint)CONCAT11(sVar4,sVar5);
  if (((CONCAT11(sVar4,sVar5) == 0) || (uVar22 <= (uint)(0x7fffffff / (ulong)y))) &&
     (y * uVar22 < 0x20000000)) {
    stbi__get32be(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get8(s);
    puVar8 = (uchar *)stbi__malloc_mad3(uVar22,y,4,0);
    local_a8 = (ulong)uVar22;
    memset(puVar8,0xff,(ulong)(uVar22 * y * 4));
    uVar22 = 0;
    bVar2 = 0;
    piVar20 = comp;
    do {
      if (uVar22 == 10) {
        pcVar9 = "bad format";
LAB_00137800:
        *(char **)(in_FS_OFFSET + -0x10) = pcVar9;
        bVar1 = false;
      }
      else {
        lVar10 = (long)(int)uVar22;
        uVar22 = uVar22 + 1;
        lVar10 = lVar10 * 3;
        bVar6 = stbi__get8(s);
        piVar20 = (int *)(ulong)bVar6;
        sVar4 = stbi__get8(s);
        asStack_58[lVar10] = sVar4;
        sVar5 = stbi__get8(s);
        asStack_58[lVar10 + 1] = sVar5;
        bVar6 = stbi__get8(s);
        asStack_58[lVar10 + 2] = bVar6;
        bVar2 = bVar2 | bVar6;
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001377d8:
          if (s->img_buffer_end <= s->img_buffer) {
LAB_001377f9:
            pcVar9 = "bad file";
            goto LAB_00137800;
          }
        }
        else {
          iVar15 = (*(s->io).eof)(s->io_user_data);
          if (iVar15 != 0) {
            if (s->read_from_callbacks != 0) goto LAB_001377d8;
            goto LAB_001377f9;
          }
        }
        bVar1 = true;
        pcVar9 = "bad format";
        if (sVar4 != '\b') goto LAB_00137800;
      }
      iVar15 = (int)piVar20;
      if (!bVar1) {
        puVar13 = (uchar *)0x0;
        goto LAB_00137bee;
      }
      if (iVar15 == 0) {
        iVar15 = 4 - (uint)((bVar2 & 0x10) == 0);
        if (comp != (int *)0x0) {
          *comp = iVar15;
        }
        puVar13 = puVar8;
        if (y != 0) {
          local_88 = (int)local_a8 * 4;
          local_80 = (ulong)y;
          local_78 = (ulong)uVar22;
          local_90 = (ulong)((int)local_90 + (uint)bVar3);
          local_a0 = 0;
          do {
            if (0 < (int)uVar22) {
              local_98 = puVar8 + local_88 * (int)local_a0;
              uVar12 = 0;
              do {
                lVar10 = uVar12 * 3;
                sVar4 = asStack_58[lVar10 + 1];
                local_70 = uVar12;
                if (sVar4 == '\0') {
                  if ((int)local_a8 != 0) {
                    bVar2 = asStack_58[lVar10 + 2];
                    uVar12 = local_90 & 0xffffffff;
                    psVar17 = local_98;
                    do {
                      psVar11 = stbi__readval(s,(uint)bVar2,psVar17);
                      if (psVar11 == (stbi_uc *)0x0) goto LAB_00137be9;
                      psVar17 = psVar17 + 4;
                      uVar14 = (int)uVar12 - 1;
                      uVar12 = (ulong)uVar14;
                    } while (uVar14 != 0);
                  }
                }
                else {
                  uVar12 = local_a8 & 0xffffffff;
                  psVar17 = local_98;
                  if (sVar4 == '\x01') {
                    while (iVar21 = (int)uVar12, 0 < iVar21) {
                      bVar2 = stbi__get8(s);
                      if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00137a86:
                        if (s->img_buffer < s->img_buffer_end) goto LAB_00137a96;
LAB_00137af8:
                        *(char **)(in_FS_OFFSET + -0x10) = "bad file";
LAB_00137b08:
                        bVar1 = false;
                      }
                      else {
                        iVar7 = (*(s->io).eof)(s->io_user_data);
                        if (iVar7 != 0) {
                          if (s->read_from_callbacks != 0) goto LAB_00137a86;
                          goto LAB_00137af8;
                        }
LAB_00137a96:
                        psVar11 = stbi__readval(s,(uint)asStack_58[lVar10 + 2],local_ac);
                        if (psVar11 == (stbi_uc *)0x0) goto LAB_00137b08;
                        if (iVar21 < (int)(uint)bVar2) {
                          bVar2 = (byte)uVar12;
                        }
                        if (bVar2 != 0) {
                          uVar14 = 0;
                          do {
                            bVar3 = asStack_58[lVar10 + 2];
                            uVar16 = 0x80;
                            lVar19 = 0;
                            do {
                              if ((uVar16 & bVar3) != 0) {
                                psVar17[lVar19] = local_ac[lVar19];
                              }
                              lVar19 = lVar19 + 1;
                              uVar16 = uVar16 >> 1;
                            } while (lVar19 != 4);
                            uVar14 = uVar14 + 1;
                            psVar17 = psVar17 + 4;
                          } while (uVar14 != bVar2);
                        }
                        uVar12 = (ulong)(iVar21 - (uint)bVar2);
                        bVar1 = true;
                      }
                      if (!bVar1) goto LAB_00137be9;
                    }
                  }
                  else {
                    uVar12 = local_a8 & 0xffffffff;
                    if (sVar4 != '\x02') {
                      *(char **)(in_FS_OFFSET + -0x10) = "bad format";
LAB_00137be9:
                      puVar13 = (uchar *)0x0;
                      goto LAB_00137bee;
                    }
                    while (iVar21 = (int)uVar12, 0 < iVar21) {
                      bVar2 = stbi__get8(s);
                      if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00137920:
                        if (s->img_buffer < s->img_buffer_end) goto LAB_00137930;
LAB_00137975:
                        *(char **)(in_FS_OFFSET + -0x10) = "bad file";
LAB_00137985:
                        bVar1 = false;
                      }
                      else {
                        iVar7 = (*(s->io).eof)(s->io_user_data);
                        if (iVar7 != 0) {
                          if (s->read_from_callbacks != 0) goto LAB_00137920;
                          goto LAB_00137975;
                        }
LAB_00137930:
                        uVar14 = (uint)bVar2;
                        if ((char)bVar2 < '\0') {
                          if (uVar14 == 0x80) {
                            sVar4 = stbi__get8(s);
                            sVar5 = stbi__get8(s);
                            uVar16 = (uint)CONCAT11(sVar4,sVar5);
                          }
                          else {
                            uVar16 = uVar14 - 0x7f;
                          }
                          if (iVar21 < (int)uVar16) {
                            *(char **)(in_FS_OFFSET + -0x10) = "bad file";
LAB_00137a46:
                            bVar1 = false;
                          }
                          else {
                            psVar11 = stbi__readval(s,(uint)asStack_58[lVar10 + 2],local_ac);
                            if (psVar11 == (stbi_uc *)0x0) goto LAB_00137a46;
                            bVar1 = true;
                            if (0 < (int)uVar16) {
                              uVar14 = 0;
                              do {
                                bVar2 = asStack_58[lVar10 + 2];
                                uVar18 = 0x80;
                                lVar19 = 0;
                                do {
                                  if ((uVar18 & bVar2) != 0) {
                                    psVar17[lVar19] = local_ac[lVar19];
                                  }
                                  lVar19 = lVar19 + 1;
                                  uVar18 = uVar18 >> 1;
                                } while (lVar19 != 4);
                                uVar14 = uVar14 + 1;
                                psVar17 = psVar17 + 4;
                              } while (uVar14 != uVar16);
                            }
                          }
                          if (!bVar1) goto LAB_00137985;
                        }
                        else {
                          if (iVar21 <= (int)uVar14) {
                            *(char **)(in_FS_OFFSET + -0x10) = "bad file";
LAB_001379c5:
                            bVar1 = false;
                            goto LAB_00137a55;
                          }
                          uVar16 = bVar2 + 1;
                          iVar7 = uVar14 + 1;
                          do {
                            psVar11 = stbi__readval(s,(uint)asStack_58[lVar10 + 2],psVar17);
                            if (psVar11 == (stbi_uc *)0x0) goto LAB_001379c5;
                            psVar17 = psVar17 + 4;
                            iVar7 = iVar7 + -1;
                          } while (iVar7 != 0);
                        }
                        uVar12 = (ulong)(iVar21 - uVar16);
                        bVar1 = true;
                      }
LAB_00137a55:
                      if (!bVar1) goto LAB_00137be9;
                    }
                  }
                }
                uVar12 = local_70 + 1;
              } while (uVar12 != local_78);
            }
            local_a0 = local_a0 + 1;
          } while (local_a0 != local_80);
        }
LAB_00137bee:
        uVar12 = local_a8;
        if (puVar13 == (uchar *)0x0) {
          free(puVar8);
          puVar8 = (uchar *)0x0;
        }
        *local_68 = (uint)uVar12;
        *local_60 = y;
        if (local_84 != 0) {
          iVar15 = local_84;
        }
        if (local_84 == 0 && comp != (int *)0x0) {
          iVar15 = *comp;
        }
        puVar8 = stbi__convert_format(puVar8,4,iVar15,(uint)uVar12,y);
        return puVar8;
      }
    } while( true );
  }
  pcVar9 = "too large";
LAB_00137bba:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar9;
  return (void *)0x0;
}

Assistant:

static void *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp, stbi__result_info *ri)
{
   stbi_uc *result;
   int i, x,y, internal_comp;
   STBI_NOTUSED(ri);

   if (!comp) comp = &internal_comp;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);

   if (y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if (!stbi__mad3sizes_valid(x, y, 4, 0)) return stbi__errpuc("too large", "PIC image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc_mad3(x, y, 4, 0);
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}